

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_idx(cmd_code code)

{
  long lVar1;
  command_info *pcVar2;
  
  pcVar2 = game_cmds;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x71) {
      return L'\xffffffff';
    }
    if (pcVar2->cmd == code) break;
    lVar1 = lVar1 + 1;
    pcVar2 = pcVar2 + 1;
  }
  return (wchar_t)lVar1;
}

Assistant:

static int cmd_idx(cmd_code code)
{
	size_t i;

	for (i = 0; i < N_ELEMENTS(game_cmds); i++)
		if (game_cmds[i].cmd == code)
			return i;

	return CMD_ARG_NOT_PRESENT;
}